

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

int build_json(ps_config_t *config,char *json,int len)

{
  char *pcVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  hash_iter_t *itor;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  
  uVar3 = snprintf(json,(ulong)(uint)len,"{\n");
  iVar9 = -1;
  if (-1 < (int)uVar3) {
    pcVar11 = json + uVar3;
    uVar4 = uVar3;
    if (json == (char *)0x0) {
      uVar4 = 0;
      pcVar11 = (char *)0x0;
    }
    iVar9 = len - uVar4;
    for (itor = hash_table_iter(config->ht); itor != (hash_iter_t *)0x0;
        itor = hash_table_iter_next(itor)) {
      pcVar8 = itor->ent->key;
      plVar2 = (long *)itor->ent->val;
      if (((*(byte *)(plVar2 + 1) & 8) == 0) || (*plVar2 != 0)) {
        if (pcVar11 == (char *)0x0) {
          sVar6 = strlen(pcVar8);
          sVar7 = measure_string((uint)sVar6,pcVar8);
          iVar5 = (int)sVar7;
        }
        else {
          pcVar11[0] = '\t';
          pcVar11[1] = '\"';
          if (iVar9 < 3) {
            __assert_fail("maxlen > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,400,"int serialize_key(char *, int, const char *)");
          }
          pcVar1 = pcVar11 + 2;
          sVar6 = strlen(pcVar8);
          sVar7 = serialize_string(pcVar1,(uint)sVar6,pcVar8);
          iVar5 = (int)sVar7;
          if (iVar9 + -2 <= iVar5) {
            __assert_fail("maxlen > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                          ,0x19b,"int serialize_key(char *, int, const char *)");
          }
          (pcVar1 + iVar5)[0] = '\"';
          (pcVar1 + iVar5)[1] = ':';
          pcVar11[(long)iVar5 + 4] = ' ';
        }
        if (iVar5 < -5) {
          return -1;
        }
        uVar10 = iVar5 + 5;
        uVar4 = uVar10;
        pcVar1 = pcVar11 + uVar10;
        if (pcVar11 == (char *)0x0) {
          uVar4 = 0;
          pcVar1 = pcVar11;
        }
        iVar9 = iVar9 - uVar4;
        uVar4 = *(uint *)(plVar2 + 1);
        if ((uVar4 & 8) == 0) {
          if ((uVar4 & 2) == 0) {
            if ((uVar4 & 0x10) != 0) {
              pcVar11 = "true";
              if (*plVar2 == 0) {
                pcVar11 = "false";
              }
              pcVar8 = "%s,\n";
              goto LAB_001076c0;
            }
            if ((uVar4 & 4) == 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                      ,0x1f5,"Unknown type %d for parameter %s\n",(ulong)uVar4,pcVar8);
              uVar4 = uVar10;
              goto LAB_001076cb;
            }
            uVar4 = snprintf(pcVar1,(long)iVar9,"%g,\n",*plVar2);
          }
          else {
            pcVar11 = (char *)*plVar2;
            pcVar8 = "%ld,\n";
LAB_001076c0:
            uVar4 = snprintf(pcVar1,(long)iVar9,pcVar8,pcVar11);
          }
          if ((int)uVar4 < 0) {
            return -1;
          }
        }
        else {
          pcVar11 = (char *)*plVar2;
          if (pcVar1 == (char *)0x0) {
            sVar6 = strlen(pcVar11);
            sVar7 = measure_string((uint)sVar6,pcVar11);
            iVar5 = (int)sVar7;
          }
          else {
            *pcVar1 = '\"';
            if (iVar9 < 2) {
              __assert_fail("maxlen > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                            ,0x1af,"int serialize_value(char *, int, const char *)");
            }
            pcVar8 = pcVar1 + 1;
            sVar6 = strlen(pcVar11);
            sVar7 = serialize_string(pcVar8,(uint)sVar6,pcVar11);
            iVar5 = (int)sVar7;
            if (-2 < iVar5 - iVar9) {
              __assert_fail("maxlen > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                            ,0x1ba,"int serialize_value(char *, int, const char *)");
            }
            (pcVar8 + iVar5)[0] = '\"';
            (pcVar8 + iVar5)[1] = ',';
            pcVar1[(long)iVar5 + 3] = '\n';
          }
          if (iVar5 < -4) {
            return -1;
          }
          uVar4 = iVar5 + 4;
        }
LAB_001076cb:
        uVar3 = uVar10 + uVar3 + uVar4;
        pcVar11 = pcVar1 + uVar4;
        if (pcVar1 == (char *)0x0) {
          uVar4 = 0;
          pcVar11 = pcVar1;
        }
        iVar9 = iVar9 - uVar4;
      }
    }
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else if (json + 1 < pcVar11) {
      iVar9 = iVar9 + 2;
      pcVar11 = pcVar11 + -2;
    }
    iVar5 = snprintf(pcVar11,(long)iVar9,"\n}\n");
    iVar9 = -1;
    if (-1 < iVar5) {
      iVar9 = uVar3 + iVar5;
    }
  }
  return iVar9;
}

Assistant:

static int
build_json(ps_config_t *config, char *json, int len)
{
    hash_iter_t *itor;
    char *ptr = json;
    int l, rv = 0;

    if ((l = snprintf(ptr, len, "{\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    for (itor = hash_table_iter(config->ht); itor;
         itor = hash_table_iter_next(itor)) {
        const char *key = hash_entry_key(itor->ent);
        cmd_ln_val_t *cval = hash_entry_val(itor->ent);
        if (cval->type & ARG_STRING && cval->val.ptr == NULL)
            continue;
        if ((l = serialize_key(ptr, len, key)) < 0)
            return -1;
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
        if (cval->type & ARG_STRING) {
            if ((l = serialize_value(ptr, len,
                                     (char *)cval->val.ptr)) < 0)
                return -1;
        }
        else if (cval->type & ARG_INTEGER) {
            if ((l = snprintf(ptr, len, "%ld,\n",
                              cval->val.i)) < 0)
                return -1;
        }
        else if (cval->type & ARG_BOOLEAN) {
            if ((l = snprintf(ptr, len, "%s,\n",
                              cval->val.i ? "true" : "false")) < 0)
                return -1;
        }
        else if (cval->type & ARG_FLOATING) {
            if ((l = snprintf(ptr, len, "%g,\n",
                              cval->val.fl)) < 0)
                return -1;
        }
        else {
            E_ERROR("Unknown type %d for parameter %s\n",
                    cval->type, key);
        }
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
    }
    /* Back off last comma because JSON is awful */
    if (ptr && ptr > json + 1) {
        len += 2;
        ptr -= 2;
    }
    if ((l = snprintf(ptr, len, "\n}\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    return rv;
}